

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::php::Generator::Generate
          (Generator *this,FileDescriptor *file,Options *options,GeneratorContext *generator_context
          ,string *error)

{
  long lVar1;
  MethodDescriptor *this_00;
  size_t sVar2;
  void *__s1;
  void *__s2;
  _Base_ptr size;
  Rep *pRVar3;
  undefined8 *puVar4;
  string *full_name;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [8];
  bool bVar8;
  int iVar9;
  int iVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  _Rb_tree_node_base *p_Var13;
  _Base_ptr p_Var14;
  FileDescriptorProto *pFVar15;
  FileDescriptor *pFVar16;
  long *plVar17;
  ulong uVar18;
  Descriptor *pDVar19;
  char *pcVar20;
  Options *pOVar21;
  void **ppvVar22;
  long *plVar23;
  bool is_descriptor;
  bool is_descriptor_00;
  bool is_descriptor_01;
  ServiceDescriptor *extraout_RDX;
  ServiceDescriptor *extraout_RDX_00;
  ServiceDescriptor *extraout_RDX_01;
  ServiceDescriptor *extraout_RDX_02;
  ServiceDescriptor *extraout_RDX_03;
  ServiceDescriptor *extraout_RDX_04;
  ServiceDescriptor *extraout_RDX_05;
  ServiceDescriptor *extraout_RDX_06;
  ServiceDescriptor *desc;
  void **ppvVar24;
  long lVar25;
  long lVar26;
  char *pcVar27;
  size_type sVar28;
  _Base_ptr p_Var29;
  ulong uVar30;
  long lVar31;
  pair<std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>,_std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>_>
  pVar32;
  pair<std::_Rb_tree_iterator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>,_std::_Rb_tree_iterator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
  pVar33;
  string files_data;
  map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
  deps;
  FileDescriptor *file_node;
  map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
  dependency_count;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  nodes_without_dependency;
  FileDescriptorSet sorted_file_set;
  string dependency_filename;
  Printer printer;
  string fullname;
  string filename;
  undefined1 local_298 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_278;
  _Alloc_hider local_270;
  char *local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  undefined1 local_230 [8];
  _Base_ptr local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Base_ptr local_210;
  _Base_ptr local_208;
  _Base_ptr local_200;
  void **local_1f8;
  FileDescriptor *local_1f0;
  FileDescriptor *local_1e8;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1e0;
  undefined1 local_1d8 [32];
  _Base_ptr local_1b8;
  size_t local_1b0;
  Options *local_1a8;
  undefined1 local_1a0 [8];
  _Rb_tree_node_base local_198;
  size_t local_178;
  undefined1 local_170 [16];
  RepeatedPtrFieldBase local_160;
  ZeroCopyOutputStream *local_140;
  string local_138;
  _Base_ptr *local_118;
  ZeroCopyOutputStream *local_110;
  undefined1 local_108;
  undefined7 uStack_107;
  _Rb_tree_node_base *p_Stack_100;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_78;
  undefined1 local_70 [64];
  
  pcVar27 = (char *)error;
  local_1a8 = (Options *)generator_context;
  if (options->is_descriptor == true) {
    sVar2 = (*(undefined8 **)file)[1];
    if ((sVar2 != kDescriptorFile_abi_cxx11_._M_string_length) ||
       ((sVar2 != 0 &&
        (iVar9 = bcmp((void *)**(undefined8 **)file,kDescriptorFile_abi_cxx11_._M_dataplus._M_p,
                      sVar2), iVar9 != 0)))) {
      pcVar27 = (char *)error->_M_string_length;
      pcVar20 = "Can only generate PHP code for google/protobuf/descriptor.proto.\n";
LAB_002738bf:
      std::__cxx11::string::_M_replace((ulong)error,0,pcVar27,(ulong)pcVar20);
      return false;
    }
  }
  else if (file[0x3a] != (FileDescriptor)0x3) {
    pcVar27 = (char *)error->_M_string_length;
    pcVar20 = 
    "Can only generate PHP code for proto3 .proto files.\nPlease add \'syntax = \"proto3\";\' to the top of your .proto file.\n"
    ;
    goto LAB_002738bf;
  }
  pOVar21 = local_1a8;
  (anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
            ((string *)(local_70 + 0x20),(_anonymous_namespace_ *)file,(FileDescriptor *)options,
             local_1a8);
  local_140 = (ZeroCopyOutputStream *)
              (**(code **)(*(long *)pOVar21 + 0x10))(pOVar21,(string *)(local_70 + 0x20));
  io::Printer::Printer((Printer *)&local_118,local_140,'^');
  io::Printer::Print<char[9],std::__cxx11::string>
            ((Printer *)&local_118,
             "<?php\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: ^filename^\n\n"
             ,(char (*) [9])"filename",
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)file);
  anon_unknown_2::FilenameToClassname((string *)local_70,(string *)(local_70 + 0x20));
  iVar9 = std::__cxx11::string::find_last_of(local_70,0x3d9bdf,0xffffffffffffffff);
  if (iVar9 == -1) {
    pOVar21 = (Options *)local_70;
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)&local_118,"class ^name^\n{\n",(char (*) [5])0x3ea8a1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar21);
  }
  else {
    std::__cxx11::string::substr((ulong)local_298,(ulong)local_70);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)&local_118,"namespace ^name^;\n\n",(char (*) [5])0x3ea8a1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._0_8_ != &local_288) {
      operator_delete((void *)local_298._0_8_);
    }
    std::__cxx11::string::substr((ulong)local_298,(ulong)local_70);
    pOVar21 = (Options *)local_298;
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)&local_118,"class ^name^\n{\n",(char (*) [5])0x3ea8a1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar21);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._0_8_ != &local_288) {
      operator_delete((void *)local_298._0_8_);
    }
  }
  io::Printer::Indent((Printer *)&local_118);
  io::Printer::Indent((Printer *)&local_118);
  io::Printer::Print<>
            ((Printer *)&local_118,
             "public static $is_initialized = false;\n\npublic static function initOnce() {\n");
  io::Printer::Indent((Printer *)&local_118);
  io::Printer::Indent((Printer *)&local_118);
  local_1e8 = file;
  if (options->aggregate_metadata == true) {
    io::Printer::Print<>
              ((Printer *)&local_118,
               "$pool = \\Google\\Protobuf\\Internal\\DescriptorPool::getGeneratedPool();\nif (static::$is_initialized == true) {\n  return;\n}\n"
              );
    local_220._8_8_ = &local_228;
    local_228 = (_Base_ptr)((ulong)local_228 & 0xffffffff00000000);
    local_220._M_allocated_capacity = 0;
    local_208 = (_Base_ptr)0x0;
    local_1d8._24_8_ = local_1d8 + 8;
    local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffff00000000;
    local_1d8._16_8_ = (_Base_ptr)0x0;
    local_1b0 = 0;
    local_198._M_left = &local_198;
    local_198._0_8_ = local_198._0_8_ & 0xffffffff00000000;
    local_198._M_parent = (_Base_ptr)0x0;
    local_178 = 0;
    local_210 = (_Base_ptr)local_220._8_8_;
    local_1b8 = (_Base_ptr)local_1d8._24_8_;
    local_198._M_right = local_198._M_left;
    FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)local_170,(Arena *)0x0,false);
    anon_unknown_2::AnalyzeDependencyForFile
              (file,(set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     *)local_1a0,
               (map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                *)local_230,
               (map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                *)local_1d8);
    if (local_178 != 0) {
      local_200 = &(options->aggregate_metadata_prefixes)._M_t._M_impl.super__Rb_tree_header.
                   _M_header;
      do {
        local_1f0 = *(FileDescriptor **)(local_198._M_left + 1);
        pVar32 = std::
                 _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 ::equal_range((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                *)local_1a0,&local_1f0);
        std::
        _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ::_M_erase_aux((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        *)local_1a0,(_Base_ptr)pVar32.first._M_node,(_Base_ptr)pVar32.second._M_node
                      );
        pmVar11 = std::
                  map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                  ::operator[]((map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                                *)local_230,&local_1f0);
        p_Var13 = (pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        pFVar16 = local_1f0;
        while (local_1f0 = pFVar16,
              (_Rb_tree_header *)p_Var13 != &(pmVar11->_M_t)._M_impl.super__Rb_tree_header) {
          local_298._0_8_ = *(undefined8 *)(p_Var13 + 1);
          pmVar12 = std::
                    map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                    ::operator[]((map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                                  *)local_1d8,(key_type *)local_298);
          if (*pmVar12 == 1) {
            pVar33 = std::
                     _Rb_tree<const_google::protobuf::FileDescriptor_*,_std::pair<const_google::protobuf::FileDescriptor_*const,_int>,_std::_Select1st<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                     ::equal_range((_Rb_tree<const_google::protobuf::FileDescriptor_*,_std::pair<const_google::protobuf::FileDescriptor_*const,_int>,_std::_Select1st<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                                    *)local_1d8,(key_type *)local_298);
            std::
            _Rb_tree<const_google::protobuf::FileDescriptor_*,_std::pair<const_google::protobuf::FileDescriptor_*const,_int>,_std::_Select1st<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
            ::_M_erase_aux((_Rb_tree<const_google::protobuf::FileDescriptor_*,_std::pair<const_google::protobuf::FileDescriptor_*const,_int>,_std::_Select1st<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                            *)local_1d8,(_Base_ptr)pVar33.first._M_node,
                           (_Base_ptr)pVar33.second._M_node);
            std::
            _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
            ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                      ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                        *)local_1a0,(FileDescriptor **)local_298);
          }
          else {
            pmVar12 = std::
                      map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                      ::operator[]((map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                                    *)local_1d8,(key_type *)local_298);
            *pmVar12 = *pmVar12 + -1;
          }
          p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
          pFVar16 = local_1f0;
        }
        if ((options->aggregate_metadata_prefixes)._M_t._M_impl.super__Rb_tree_header._M_node_count
            == 0) {
LAB_00273bee:
          if ((local_160.rep_ == (Rep *)0x0) ||
             (lVar25 = (long)local_160.current_size_,
             (local_160.rep_)->allocated_size <= local_160.current_size_)) {
            pFVar15 = Arena::CreateMaybeMessage<google::protobuf::FileDescriptorProto>
                                (local_160.arena_);
            pFVar15 = (FileDescriptorProto *)
                      internal::RepeatedPtrFieldBase::AddOutOfLineHelper(&local_160,pFVar15);
          }
          else {
            local_160.current_size_ = local_160.current_size_ + 1;
            pFVar15 = (FileDescriptorProto *)(local_160.rep_)->elements[lVar25];
          }
          FileDescriptor::CopyTo(local_1f0,pFVar15);
          sVar28 = kDescriptorFile_abi_cxx11_._M_string_length;
          pRVar3 = (pFVar15->dependency_).super_RepeatedPtrFieldBase.rep_;
          local_1f8 = pRVar3->elements;
          if (pRVar3 == (Rep *)0x0) {
            local_1f8 = (void **)0x0;
          }
          lVar25 = (long)(pFVar15->dependency_).super_RepeatedPtrFieldBase.current_size_;
          if (lVar25 != 0) {
            local_78 = &pFVar15->dependency_;
            local_1e0 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)kDescriptorFile_abi_cxx11_._M_dataplus._M_p;
            uVar30 = 8;
            lVar31 = -8;
            lVar26 = 0;
            do {
              if ((*(_func_int **)((long)local_1f8[lVar26] + 8) != (_func_int *)sVar28) ||
                 ((sVar28 != 0 && (iVar9 = bcmp(*local_1f8[lVar26],local_1e0,sVar28), iVar9 != 0))))
              {
                RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::DeleteSubrange(local_78,(int)lVar26,(int)(uVar30 >> 3) - (int)lVar26);
                break;
              }
              lVar26 = lVar26 + 1;
              uVar30 = uVar30 + 8;
              lVar1 = lVar25 * 8 + lVar31;
              lVar31 = lVar31 + -8;
            } while (lVar1 != 0);
          }
          internal::RepeatedPtrFieldBase::
          Clear<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                    (&(pFVar15->extension_).super_RepeatedPtrFieldBase);
          if ((pFVar15->message_type_).super_RepeatedPtrFieldBase.current_size_ != 0) {
            pRVar3 = (pFVar15->message_type_).super_RepeatedPtrFieldBase.rep_;
            ppvVar24 = pRVar3->elements;
            if (pRVar3 == (Rep *)0x0) {
              ppvVar24 = (void **)0x0;
            }
            do {
              internal::RepeatedPtrFieldBase::
              Clear<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                        ((RepeatedPtrFieldBase *)((long)*ppvVar24 + 0x78));
              ppvVar24 = ppvVar24 + 1;
              pRVar3 = (pFVar15->message_type_).super_RepeatedPtrFieldBase.rep_;
              ppvVar22 = pRVar3->elements;
              if (pRVar3 == (Rep *)0x0) {
                ppvVar22 = (void **)0x0;
              }
            } while (ppvVar24 !=
                     ppvVar22 + (pFVar15->message_type_).super_RepeatedPtrFieldBase.current_size_);
          }
        }
        else {
          p_Var14 = (options->aggregate_metadata_prefixes)._M_t._M_impl.super__Rb_tree_header.
                    _M_header._M_left;
          if (p_Var14 != local_200) {
            do {
              __s1 = (void *)**(undefined8 **)(pFVar16 + 8);
              p_Var29 = (_Base_ptr)(*(undefined8 **)(pFVar16 + 8))[1];
              if ((long)p_Var29 < 0) {
                stringpiece_internal::StringPiece::LogFatalSizeTooBig
                          ((size_t)p_Var29,"string length exceeds max size");
              }
              __s2 = *(void **)(p_Var14 + 1);
              size = p_Var14[1]._M_parent;
              if ((long)size < 0) {
                stringpiece_internal::StringPiece::LogFatalSizeTooBig
                          ((size_t)size,"string length exceeds max size");
              }
              if ((size <= p_Var29) && (iVar9 = bcmp(__s1,__s2,(size_t)size), iVar9 == 0))
              goto LAB_00273bee;
              p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
            } while (p_Var14 != local_200);
          }
          local_298._0_8_ = local_298._0_8_ & 0xffffffffff000000;
          local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffff00000000;
          local_288._8_8_ = 0;
          local_278 = &local_288;
          local_268 = (char *)0x0;
          local_270._M_p = (pointer)local_278;
          (anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
                    (&local_138,(_anonymous_namespace_ *)local_1f0,(FileDescriptor *)local_298,
                     (Options *)0x0);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_298 + 8));
          anon_unknown_2::FilenameToClassname((string *)local_298,&local_138);
          io::Printer::Print<char[5],std::__cxx11::string>
                    ((Printer *)&local_118,"\\^name^::initOnce();\n",(char (*) [5])0x3ea8a1,
                     (string *)local_298);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._0_8_ != &local_288) {
            operator_delete((void *)local_298._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
        }
      } while (local_178 != 0);
    }
    local_298._0_8_ = &local_288;
    local_298._8_8_ = 0;
    local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
    MessageLite::SerializeToString((MessageLite *)local_170,(string *)local_298);
    io::Printer::Print<>((Printer *)&local_118,"$pool->internalAddGeneratedFile(\n");
    io::Printer::Indent((Printer *)&local_118);
    io::Printer::Indent((Printer *)&local_118);
    io::Printer::Print<>((Printer *)&local_118,"\'");
    uVar6 = local_298._8_8_;
    uVar5 = local_298._0_8_;
    if (local_298._8_8_ != 0) {
      sVar28 = 0;
      do {
        pcVar20 = "\\\'";
        if (*(char *)(uVar5 + sVar28) == '\'') {
LAB_00273efc:
          io::Printer::Print<>((Printer *)&local_118,pcVar20);
        }
        else {
          if (*(char *)(uVar5 + sVar28) == '\\') {
            pcVar20 = "\\\\";
            goto LAB_00273efc;
          }
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_138,'\x01');
          io::Printer::Print<char[5],std::__cxx11::string>
                    ((Printer *)&local_118,"^char^",(char (*) [5])"char",&local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
        }
        sVar28 = sVar28 + 1;
      } while (uVar6 != sVar28);
    }
    io::Printer::Print<>((Printer *)&local_118,"\'\n");
    io::Printer::Outdent((Printer *)&local_118);
    io::Printer::Outdent((Printer *)&local_118);
    io::Printer::Print<>((Printer *)&local_118,", true);\n");
    io::Printer::Print<>((Printer *)&local_118,"static::$is_initialized = true;\n");
    file = local_1e8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._0_8_ != &local_288) {
      operator_delete((void *)local_298._0_8_);
    }
    FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)local_170);
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~_Rb_tree((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)local_1a0);
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_std::pair<const_google::protobuf::FileDescriptor_*const,_int>,_std::_Select1st<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
    ::~_Rb_tree((_Rb_tree<const_google::protobuf::FileDescriptor_*,_std::pair<const_google::protobuf::FileDescriptor_*const,_int>,_std::_Select1st<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                 *)local_1d8);
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>,_std::_Select1st<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<const_google::protobuf::FileDescriptor_*,_std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>,_std::_Select1st<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                 *)local_230);
    goto LAB_002744a0;
  }
  io::Printer::Print<>
            ((Printer *)&local_118,
             "$pool = \\Google\\Protobuf\\Internal\\DescriptorPool::getGeneratedPool();\n\nif (static::$is_initialized == true) {\n  return;\n}\n"
            );
  if (options->is_descriptor == false) {
    if (0 < *(int *)(file + 0x20)) {
      iVar9 = 0;
      do {
        pFVar16 = FileDescriptor::dependency(file,iVar9);
        sVar2 = (*(undefined8 **)pFVar16)[1];
        if ((sVar2 != kDescriptorFile_abi_cxx11_._M_string_length) ||
           ((sVar2 != 0 &&
            (iVar10 = bcmp((void *)**(undefined8 **)pFVar16,
                           kDescriptorFile_abi_cxx11_._M_dataplus._M_p,sVar2), iVar10 != 0)))) {
          pFVar16 = FileDescriptor::dependency(local_1e8,iVar9);
          (anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
                    ((string *)local_298,(_anonymous_namespace_ *)pFVar16,(FileDescriptor *)options,
                     pOVar21);
          anon_unknown_2::FilenameToClassname((string *)local_230,(string *)local_298);
          pOVar21 = (Options *)local_230;
          io::Printer::Print<char[5],std::__cxx11::string>
                    ((Printer *)&local_118,"\\^name^::initOnce();\n",(char (*) [5])0x3ea8a1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230)
          ;
          if (local_230 != (undefined1  [8])&local_220) {
            operator_delete((void *)local_230);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._0_8_ != &local_288) {
            operator_delete((void *)local_298._0_8_);
          }
        }
        iVar9 = iVar9 + 1;
        file = local_1e8;
      } while (iVar9 < *(int *)(local_1e8 + 0x20));
    }
    FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)local_298,(Arena *)0x0,false);
    if (local_278 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
LAB_002741df:
      pFVar15 = Arena::CreateMaybeMessage<google::protobuf::FileDescriptorProto>
                          ((Arena *)local_288._M_allocated_capacity);
      pFVar15 = (FileDescriptorProto *)
                internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                          ((RepeatedPtrFieldBase *)&local_288,pFVar15);
    }
    else {
      lVar25 = (long)(int)local_288._8_4_;
      if (*(int *)local_278 <= (int)local_288._8_4_) goto LAB_002741df;
      local_288._8_4_ = local_288._8_4_ + 1;
      pFVar15 = *(FileDescriptorProto **)((long)local_278 + lVar25 * 8 + 8);
    }
    FileDescriptor::CopyTo(file,pFVar15);
    sVar28 = kDescriptorFile_abi_cxx11_._M_string_length;
    pRVar3 = (pFVar15->dependency_).super_RepeatedPtrFieldBase.rep_;
    local_200 = (_Base_ptr)pRVar3->elements;
    if (pRVar3 == (Rep *)0x0) {
      local_200 = (_Base_ptr)0x0;
    }
    lVar25 = (long)(pFVar15->dependency_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar25 != 0) {
      local_1e0 = &pFVar15->dependency_;
      local_1f8 = (void **)kDescriptorFile_abi_cxx11_._M_dataplus._M_p;
      uVar30 = 8;
      lVar26 = -8;
      lVar31 = 0;
      do {
        puVar4 = *(undefined8 **)
                  (&((_Rb_tree_node_base *)&local_200->_M_color)->_M_color + lVar31 * 2);
        if ((puVar4[1] != sVar28) ||
           ((sVar28 != 0 && (iVar9 = bcmp((void *)*puVar4,local_1f8,sVar28), iVar9 != 0)))) {
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::DeleteSubrange(local_1e0,(int)lVar31,(int)(uVar30 >> 3) - (int)lVar31);
          break;
        }
        lVar31 = lVar31 + 1;
        uVar30 = uVar30 + 8;
        lVar1 = lVar26 + lVar25 * 8;
        lVar26 = lVar26 + -8;
      } while (lVar1 != 0);
    }
    internal::RepeatedPtrFieldBase::
    Clear<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
              (&(pFVar15->extension_).super_RepeatedPtrFieldBase);
    if ((pFVar15->message_type_).super_RepeatedPtrFieldBase.current_size_ != 0) {
      pRVar3 = (pFVar15->message_type_).super_RepeatedPtrFieldBase.rep_;
      ppvVar24 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        ppvVar24 = (void **)0x0;
      }
      do {
        internal::RepeatedPtrFieldBase::
        Clear<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                  ((RepeatedPtrFieldBase *)((long)*ppvVar24 + 0x78));
        ppvVar24 = ppvVar24 + 1;
        pRVar3 = (pFVar15->message_type_).super_RepeatedPtrFieldBase.rep_;
        ppvVar22 = pRVar3->elements;
        if (pRVar3 == (Rep *)0x0) {
          ppvVar22 = (void **)0x0;
        }
      } while (ppvVar24 !=
               ppvVar22 + (pFVar15->message_type_).super_RepeatedPtrFieldBase.current_size_);
    }
    local_230 = (undefined1  [8])&local_220;
    local_228 = (_Base_ptr)0x0;
    local_220._M_allocated_capacity = local_220._M_allocated_capacity & 0xffffffffffffff00;
    MessageLite::SerializeToString((MessageLite *)local_298,(string *)local_230);
    io::Printer::Print<>((Printer *)&local_118,"$pool->internalAddGeneratedFile(\n");
    io::Printer::Indent((Printer *)&local_118);
    io::Printer::Indent((Printer *)&local_118);
    io::Printer::Print<>((Printer *)&local_118,"\'");
    p_Var14 = local_228;
    auVar7 = local_230;
    if (local_228 != (_Base_ptr)0x0) {
      p_Var29 = (_Base_ptr)0x0;
      do {
        pcVar20 = "\\\'";
        if (*(char *)((long)auVar7 + (long)p_Var29) == '\'') {
LAB_002743bc:
          io::Printer::Print<>((Printer *)&local_118,pcVar20);
        }
        else {
          if (*(char *)((long)auVar7 + (long)p_Var29) == '\\') {
            pcVar20 = "\\\\";
            goto LAB_002743bc;
          }
          local_1d8._0_8_ = local_1d8 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_1d8,'\x01');
          io::Printer::Print<char[5],std::__cxx11::string>
                    ((Printer *)&local_118,"^char^",(char (*) [5])"char",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8)
          ;
          if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
            operator_delete((void *)local_1d8._0_8_);
          }
        }
        p_Var29 = (_Base_ptr)((long)&p_Var29->_M_color + 1);
      } while (p_Var14 != p_Var29);
    }
    io::Printer::Print<>((Printer *)&local_118,"\'\n");
    io::Printer::Outdent((Printer *)&local_118);
    io::Printer::Outdent((Printer *)&local_118);
    io::Printer::Print<>((Printer *)&local_118,", true);\n\n");
    file = local_1e8;
    if (local_230 != (undefined1  [8])&local_220) {
      operator_delete((void *)local_230);
    }
    FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)local_298);
  }
  else {
    if (0 < *(int *)(file + 0x2c)) {
      lVar25 = 0;
      lVar31 = 0;
      do {
        local_298._8_8_ = 0;
        local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
        local_298._0_8_ = &local_288;
        anon_unknown_2::GenerateMessageToPool
                  ((string *)local_298,(Descriptor *)(*(long *)(file + 0x58) + lVar25),
                   (Printer *)&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._0_8_ != &local_288) {
          operator_delete((void *)local_298._0_8_);
        }
        lVar31 = lVar31 + 1;
        lVar25 = lVar25 + 0x88;
      } while (lVar31 < *(int *)(file + 0x2c));
    }
    if (0 < *(int *)(file + 0x30)) {
      lVar25 = 0;
      lVar31 = 0;
      do {
        anon_unknown_2::GenerateEnumToPool
                  ((EnumDescriptor *)(*(long *)(file + 0x60) + lVar25),(Printer *)&local_118);
        lVar31 = lVar31 + 1;
        lVar25 = lVar25 + 0x48;
      } while (lVar31 < *(int *)(file + 0x30));
    }
    io::Printer::Print<>((Printer *)&local_118,"$pool->finish();\n");
  }
  io::Printer::Print<>((Printer *)&local_118,"static::$is_initialized = true;\n");
LAB_002744a0:
  io::Printer::Outdent((Printer *)&local_118);
  io::Printer::Outdent((Printer *)&local_118);
  io::Printer::Print<>((Printer *)&local_118,"}\n");
  io::Printer::Outdent((Printer *)&local_118);
  io::Printer::Outdent((Printer *)&local_118);
  io::Printer::Print<>((Printer *)&local_118,"}\n\n");
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_);
  }
  io::Printer::~Printer((Printer *)&local_118);
  desc = extraout_RDX;
  if (local_140 != (ZeroCopyOutputStream *)0x0) {
    (*local_140->_vptr_ZeroCopyOutputStream[1])();
    desc = extraout_RDX_00;
  }
  if ((_Base_ptr)local_70._32_8_ != (_Base_ptr)(local_70 + 0x30)) {
    operator_delete((void *)local_70._32_8_);
    desc = extraout_RDX_01;
  }
  pOVar21 = local_1a8;
  if (0 < *(int *)((anon_unknown_2 *)file + 0x2c)) {
    lVar25 = 0;
    lVar31 = 0;
    do {
      anon_unknown_2::GenerateMessageFile
                ((anon_unknown_2 *)file,
                 (FileDescriptor *)(*(long *)((anon_unknown_2 *)file + 0x58) + lVar25),
                 (Descriptor *)options,pOVar21,(GeneratorContext *)pcVar27);
      lVar31 = lVar31 + 1;
      lVar25 = lVar25 + 0x88;
      desc = extraout_RDX_02;
    } while (lVar31 < *(int *)((anon_unknown_2 *)file + 0x2c));
  }
  if (0 < *(int *)((anon_unknown_2 *)file + 0x30)) {
    lVar25 = 0;
    lVar31 = 0;
    do {
      anon_unknown_2::GenerateEnumFile
                ((anon_unknown_2 *)file,
                 (FileDescriptor *)(*(long *)((anon_unknown_2 *)file + 0x60) + lVar25),
                 (EnumDescriptor *)options,pOVar21,(GeneratorContext *)pcVar27);
      lVar31 = lVar31 + 1;
      lVar25 = lVar25 + 0x48;
      desc = extraout_RDX_03;
    } while (lVar31 < *(int *)((anon_unknown_2 *)file + 0x30));
  }
  if (*(char *)(*(long *)((anon_unknown_2 *)file + 0x78) + 0x9e) != '\x01') {
    return true;
  }
  if (*(int *)((anon_unknown_2 *)file + 0x34) < 1) {
    return true;
  }
  local_1e0 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  do {
    lVar25 = *(long *)(file + 0x68);
    lVar31 = (long)local_1e0 * 0x30;
    local_200 = (_Base_ptr)(lVar25 + lVar31);
    (anonymous_namespace)::GeneratedClassNameImpl_abi_cxx11_
              ((string *)&local_118,(_anonymous_namespace_ *)local_200,desc);
    lVar25 = *(long *)(lVar25 + 0x10 + lVar31);
    lVar31 = *(long *)(lVar25 + 0x78);
    if ((*(byte *)(lVar31 + 0x28) & 0x80) == 0) {
      full_name = *(string **)(lVar25 + 8);
      if (full_name->_M_string_length == 0) goto LAB_00274721;
      anon_unknown_2::PhpName
                ((string *)local_298,full_name,(Options *)(ulong)options->is_descriptor);
LAB_00274685:
      if (local_298._8_8_ == 0) goto LAB_0027472f;
      local_230 = (undefined1  [8])&local_220;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_230,local_298._0_8_,(char *)(local_298._0_8_ + local_298._8_8_));
      std::__cxx11::string::append((char *)local_230);
      plVar17 = (long *)std::__cxx11::string::_M_append((char *)local_230,(ulong)local_118);
      plVar23 = plVar17 + 2;
      if ((_Base_ptr *)*plVar17 == (_Base_ptr *)plVar23) {
        local_198._M_parent = (_Base_ptr)*plVar23;
        local_198._M_left = (_Base_ptr)plVar17[3];
        local_1a0 = (undefined1  [8])&local_198._M_parent;
      }
      else {
        local_198._M_parent = (_Base_ptr)*plVar23;
        local_1a0 = (undefined1  [8])*plVar17;
      }
      local_198._0_8_ = plVar17[1];
      *plVar17 = (long)plVar23;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      if (local_230 != (undefined1  [8])&local_220) {
        operator_delete((void *)local_230);
      }
    }
    else {
      plVar17 = (long *)(*(ulong *)(lVar31 + 0x80) & 0xfffffffffffffffe);
      lVar25 = plVar17[1];
      local_298._0_8_ = &local_288;
      if (lVar25 != 0) {
        lVar31 = *plVar17;
        std::__cxx11::string::_M_construct<char*>((string *)local_298,lVar31,lVar25 + lVar31);
        goto LAB_00274685;
      }
LAB_00274721:
      local_298._0_8_ = &local_288;
      local_298._8_8_ = 0;
      local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
LAB_0027472f:
      local_1a0 = (undefined1  [8])&local_198._M_parent;
      if (local_118 == (_Base_ptr *)&local_108) {
        local_198._M_left = p_Stack_100;
      }
      else {
        local_1a0 = (undefined1  [8])local_118;
      }
      local_198._M_parent = (_Base_ptr)CONCAT71(uStack_107,local_108);
      local_198._0_8_ = local_110;
      local_110 = (ZeroCopyOutputStream *)0x0;
      local_108 = 0;
      local_118 = (_Base_ptr *)&local_108;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._0_8_ != &local_288) {
      operator_delete((void *)local_298._0_8_);
    }
    if (local_118 != (_Base_ptr *)&local_108) {
      operator_delete(local_118);
    }
    plVar17 = (long *)std::__cxx11::string::append(local_1a0);
    local_1d8._0_8_ = local_1d8 + 0x10;
    plVar23 = plVar17 + 2;
    if ((long *)*plVar17 == plVar23) {
      local_1d8._16_8_ = *plVar23;
      local_1d8._24_8_ = plVar17[3];
    }
    else {
      local_1d8._16_8_ = *plVar23;
      local_1d8._0_8_ = (long *)*plVar17;
    }
    local_1d8._8_8_ = plVar17[1];
    *plVar17 = (long)plVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    if (local_1a0 != (undefined1  [8])&local_198._M_parent) {
      operator_delete((void *)local_1a0);
    }
    if (local_1d8._8_8_ == 0) {
      uVar30 = 0;
    }
    else {
      uVar18 = 0;
      do {
        if (*(char *)(local_1d8._0_8_ + uVar18) == '\\') {
          *(char *)(local_1d8._0_8_ + uVar18) = '/';
        }
        uVar18 = uVar18 + 1;
        uVar30 = local_1d8._8_8_;
      } while (uVar18 < (ulong)local_1d8._8_8_);
    }
    local_170._0_8_ = &local_160;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_170,local_1d8._0_8_,(pointer)(local_1d8._0_8_ + uVar30));
    std::__cxx11::string::append((char *)local_170);
    if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
      operator_delete((void *)local_1d8._0_8_);
    }
    local_1f8 = (void **)(**(code **)(*(long *)local_1a8 + 0x10))(local_1a8,local_170);
    io::Printer::Printer((Printer *)&local_118,(ZeroCopyOutputStream *)local_1f8,'^');
    io::Printer::Print<char[9],std::__cxx11::string>
              ((Printer *)&local_118,
               "<?php\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: ^filename^\n\n"
               ,(char (*) [9])"filename",
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)file);
    anon_unknown_2::FilenameToClassname((string *)local_1d8,(string *)local_170);
    iVar9 = std::__cxx11::string::find_last_of((char *)local_1d8,0x3d9bdf,0xffffffffffffffff);
    if (*(long *)((*(ulong *)(*(long *)(file + 0x78) + 0x80) & 0xfffffffffffffffe) + 8) == 0) {
      if ((*(byte *)(*(long *)(file + 0x78) + 0x28) & 0x80) == 0) {
        if ((iVar9 != -1) || (*(long *)(*(long *)(file + 8) + 8) != 0)) goto LAB_0027499b;
      }
      else if (iVar9 != -1) goto LAB_0027499b;
    }
    else {
LAB_0027499b:
      std::__cxx11::string::substr((ulong)local_298,(ulong)local_1d8);
      io::Printer::Print<char[5],std::__cxx11::string>
                ((Printer *)&local_118,"namespace ^name^;\n\n",(char (*) [5])0x3ea8a1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._0_8_ != &local_288) {
        operator_delete((void *)local_298._0_8_);
      }
    }
    io::Printer::Print<>((Printer *)&local_118,"/**\n");
    p_Var14 = local_200;
    local_288._M_allocated_capacity = (size_type)&local_278;
    local_288._8_8_ = 0;
    local_278 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((ulong)local_278 & 0xffffffffffffff00);
    local_268 = local_260._M_local_buf + 8;
    local_260._M_allocated_capacity = 0;
    local_260._M_local_buf[8] = '\0';
    local_248.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_248.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_248.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar8 = ServiceDescriptor::GetSourceLocation
                      ((ServiceDescriptor *)local_200,(SourceLocation *)local_298);
    if (bVar8) {
      anon_unknown_2::GenerateDocCommentBodyForLocation
                ((anon_unknown_2 *)&local_118,(Printer *)local_298,(SourceLocation *)0x1,false,
                 (int)pcVar27);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_248);
    if (local_268 != local_260._M_local_buf + 8) {
      operator_delete(local_268);
    }
    if ((Arena *)local_288._M_allocated_capacity != (Arena *)&local_278) {
      operator_delete((void *)local_288._M_allocated_capacity);
    }
    anon_unknown_2::EscapePhpdoc
              ((string *)local_298,(string *)(*(long *)((long)p_Var14 + 8) + 0x20));
    io::Printer::Print<char[9],std::__cxx11::string>
              ((Printer *)&local_118," * Protobuf type <code>^fullname^</code>\n */\n",
               (char (*) [9])"fullname",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._0_8_ != &local_288) {
      operator_delete((void *)local_298._0_8_);
    }
    if (iVar9 == -1) {
      io::Printer::Print<char[5],std::__cxx11::string>
                ((Printer *)&local_118,"interface ^name^\n{\n",(char (*) [5])0x3ea8a1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
    }
    else {
      std::__cxx11::string::substr((ulong)local_298,(ulong)local_1d8);
      io::Printer::Print<char[5],std::__cxx11::string>
                ((Printer *)&local_118,"interface ^name^\n{\n",(char (*) [5])0x3ea8a1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._0_8_ != &local_288) {
        operator_delete((void *)local_298._0_8_);
      }
    }
    io::Printer::Indent((Printer *)&local_118);
    io::Printer::Indent((Printer *)&local_118);
    if (0 < *(int *)((long)p_Var14 + 0x28)) {
      lVar31 = 0;
      lVar25 = 0;
      do {
        iVar9 = (int)pcVar27;
        lVar26 = *(long *)((long)p_Var14 + 0x20);
        io::Printer::Print<>((Printer *)&local_118,"/**\n");
        this_00 = (MethodDescriptor *)(lVar31 + lVar26);
        local_288._M_allocated_capacity = (size_type)&local_278;
        local_288._8_8_ = 0;
        local_278 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((ulong)local_278 & 0xffffffffffffff00);
        local_268 = local_260._M_local_buf + 8;
        local_260._M_allocated_capacity = 0;
        local_260._M_local_buf[8] = '\0';
        local_248.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_248.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_248.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar8 = MethodDescriptor::GetSourceLocation(this_00,(SourceLocation *)local_298);
        if (bVar8) {
          anon_unknown_2::GenerateDocCommentBodyForLocation
                    ((anon_unknown_2 *)&local_118,(Printer *)local_298,(SourceLocation *)0x1,false,
                     iVar9);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_248);
        if (local_268 != local_260._M_local_buf + 8) {
          operator_delete(local_268);
        }
        if ((Arena *)local_288._M_allocated_capacity != (Arena *)&local_278) {
          operator_delete((void *)local_288._M_allocated_capacity);
        }
        anon_unknown_2::UnderscoresToCamelCase
                  ((string *)local_230,*(string **)(lVar26 + 8 + lVar31),false);
        anon_unknown_2::EscapePhpdoc((string *)local_298,(string *)local_230);
        io::Printer::Print<char[12],std::__cxx11::string>
                  ((Printer *)&local_118," * Method <code>^method_name^</code>\n *\n",
                   (char (*) [12])0x428bcd,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._0_8_ != &local_288) {
          operator_delete((void *)local_298._0_8_);
        }
        if (local_230 != (undefined1  [8])&local_220) {
          operator_delete((void *)local_230);
        }
        pDVar19 = MethodDescriptor::input_type(this_00);
        anon_unknown_2::FullClassName<google::protobuf::Descriptor>
                  ((string *)local_230,pDVar19,is_descriptor);
        anon_unknown_2::EscapePhpdoc((string *)local_298,(string *)local_230);
        io::Printer::Print<char[11],std::__cxx11::string>
                  ((Printer *)&local_118," * @param \\^input_type^ $request\n",
                   (char (*) [11])0x437d3c,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._0_8_ != &local_288) {
          operator_delete((void *)local_298._0_8_);
        }
        if (local_230 != (undefined1  [8])&local_220) {
          operator_delete((void *)local_230);
        }
        pDVar19 = MethodDescriptor::output_type(this_00);
        anon_unknown_2::FullClassName<google::protobuf::Descriptor>
                  ((string *)local_230,pDVar19,is_descriptor_00);
        anon_unknown_2::EscapePhpdoc((string *)local_298,(string *)local_230);
        io::Printer::Print<char[12],std::__cxx11::string>
                  ((Printer *)&local_118," * @return \\^return_type^\n */\n",
                   (char (*) [12])"return_type",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._0_8_ != &local_288) {
          operator_delete((void *)local_298._0_8_);
        }
        if (local_230 != (undefined1  [8])&local_220) {
          operator_delete((void *)local_230);
        }
        anon_unknown_2::UnderscoresToCamelCase
                  ((string *)local_298,*(string **)(lVar26 + 8 + lVar31),false);
        pDVar19 = MethodDescriptor::input_type(this_00);
        anon_unknown_2::FullClassName<google::protobuf::Descriptor>
                  ((string *)local_230,pDVar19,is_descriptor_01);
        pcVar27 = "request_name";
        io::Printer::Print<char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                  ((Printer *)&local_118,
                   "public function ^camel_name^(\\^request_name^ $request);\n\n",
                   (char (*) [11])"camel_name",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                   (char (*) [13])"request_name",(string *)local_230);
        p_Var14 = local_200;
        if (local_230 != (undefined1  [8])&local_220) {
          operator_delete((void *)local_230);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._0_8_ != &local_288) {
          operator_delete((void *)local_298._0_8_);
        }
        lVar25 = lVar25 + 1;
        lVar31 = lVar31 + 0x40;
      } while (lVar25 < *(int *)((long)p_Var14 + 0x28));
    }
    io::Printer::Outdent((Printer *)&local_118);
    file = local_1e8;
    io::Printer::Outdent((Printer *)&local_118);
    io::Printer::Print<>((Printer *)&local_118,"}\n\n");
    if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
      operator_delete((void *)local_1d8._0_8_);
    }
    io::Printer::~Printer((Printer *)&local_118);
    desc = extraout_RDX_04;
    if (local_1f8 != (void **)0x0) {
      (**(_func_int **)((long)*local_1f8 + 8))();
      desc = extraout_RDX_05;
    }
    if ((RepeatedPtrFieldBase *)local_170._0_8_ != &local_160) {
      operator_delete((void *)local_170._0_8_);
      desc = extraout_RDX_06;
    }
    local_1e0 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)local_1e0 + 1);
    if ((long)*(int *)(file + 0x34) <= (long)local_1e0) {
      return true;
    }
  } while( true );
}

Assistant:

bool Generator::Generate(const FileDescriptor* file, const Options& options,
                         GeneratorContext* generator_context,
                         std::string* error) const {
  if (options.is_descriptor && file->name() != kDescriptorFile) {
    *error =
        "Can only generate PHP code for google/protobuf/descriptor.proto.\n";
    return false;
  }

  if (!options.is_descriptor && file->syntax() != FileDescriptor::SYNTAX_PROTO3) {
    *error =
        "Can only generate PHP code for proto3 .proto files.\n"
        "Please add 'syntax = \"proto3\";' to the top of your .proto file.\n";
    return false;
  }

  GenerateFile(file, options, generator_context);

  return true;
}